

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O2

void __thiscall
avro::detail::Chunk::Chunk(Chunk *this,data_type *data,size_type size,free_func *func)

{
  CallOnDestroy *p;
  
  p = (CallOnDestroy *)operator_new(0x20);
  boost::function0<void>::function0((function0<void> *)p,&func->super_function0<void>);
  boost::shared_ptr<avro::detail::CallOnDestroy>::shared_ptr<avro::detail::CallOnDestroy>
            (&this->callOnDestroy_,p);
  (this->underlyingBlock_).px = (char *)0x0;
  (this->underlyingBlock_).pn.pi_ = (sp_counted_base *)0x0;
  this->readPos_ = data;
  this->writePos_ = data + size;
  this->endPos_ = data + size;
  return;
}

Assistant:

Chunk(const data_type *data, size_type size, const free_func &func) :
        callOnDestroy_(new CallOnDestroy(func)),
        readPos_(const_cast<data_type *>(data)),
        writePos_(readPos_ + size),
        endPos_(writePos_)
    { }